

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Material.h
# Opt level: O0

void __thiscall FBX::Material::Material(Material *this,Node *node)

{
  double dVar1;
  undefined8 uVar2;
  const_reference __v;
  long *plVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  Vector3 VVar4;
  double local_368;
  allocator<char> local_359;
  string local_358;
  double local_338;
  allocator<char> local_329;
  string local_328;
  double local_308;
  allocator<char> local_2f9;
  string local_2f8;
  undefined8 local_2d8;
  float local_2d0;
  Vector3 local_2c8;
  allocator<char> local_2b9;
  string local_2b8;
  undefined8 local_298;
  float local_290;
  Vector3 local_288;
  allocator<char> local_279;
  string local_278;
  undefined8 local_258;
  float local_250;
  Vector3 local_248;
  allocator<char> local_239;
  string local_238;
  undefined8 local_218;
  float local_210;
  Vector3 local_208;
  allocator<char> local_1f9;
  string local_1f8;
  double local_1d8;
  allocator<char> local_1c9;
  string local_1c8;
  undefined8 local_1a8;
  float local_1a0;
  Vector3 local_198;
  allocator<char> local_189;
  string local_188;
  undefined8 local_168;
  float local_160;
  Vector3 local_158;
  allocator<char> local_149;
  string local_148;
  undefined8 local_128;
  float local_120;
  Vector3 local_118;
  allocator<char> local_109;
  string local_108;
  undefined8 local_e8;
  float local_e0;
  Vector3 local_d8;
  allocator<char> local_c9;
  string local_c8;
  double local_a8;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  undefined1 local_38 [40];
  Node *node_local;
  Material *this_local;
  
  local_38._32_8_ = node;
  node_local = (Node *)this;
  __v = std::
        vector<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
        ::operator[](&node->properties,0);
  plVar3 = std::
           get<long,short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                     (__v);
  Object::Object(&this->super_Object,*plVar3);
  std::shared_ptr<FBX::Texture>::shared_ptr(&this->texture,(nullptr_t)0x0);
  uVar2 = local_38._32_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,"ShadingModel",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"phong",&local_71);
  getProperty<std::__cxx11::string>
            (&this->shadingModel,(FBX *)uVar2,(Node *)local_38,&local_70,in_R8);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::__cxx11::string::~string((string *)local_38);
  std::allocator<char>::~allocator(&local_39);
  uVar2 = local_38._32_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"EmissiveFactor",&local_99)
  ;
  local_a8 = 0.0;
  dVar1 = getProperty<double>((Node *)uVar2,&local_98,&local_a8);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  uVar2 = local_38._32_8_;
  this->emissiveFactor = dVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"AmbientColor",&local_c9);
  local_d8.z = 0.0;
  local_d8.x = 0.0;
  local_d8.y = 0.0;
  Vector3::Vector3(&local_d8);
  VVar4 = getProperty((Node *)uVar2,&local_c8,&local_d8);
  local_e0 = VVar4.z;
  local_e8 = VVar4._0_8_;
  (this->ambientColor).z = local_e0;
  (this->ambientColor).x = (float)(int)local_e8;
  (this->ambientColor).y = (float)(int)((ulong)local_e8 >> 0x20);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  uVar2 = local_38._32_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"DiffuseColor",&local_109)
  ;
  local_118.z = 0.0;
  local_118.x = 0.0;
  local_118.y = 0.0;
  Vector3::Vector3(&local_118);
  VVar4 = getProperty((Node *)uVar2,&local_108,&local_118);
  local_120 = VVar4.z;
  local_128 = VVar4._0_8_;
  (this->diffuseColor).z = local_120;
  (this->diffuseColor).x = (float)(int)local_128;
  (this->diffuseColor).y = (float)(int)((ulong)local_128 >> 0x20);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  uVar2 = local_38._32_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"TransparentColor",&local_149);
  local_158.z = 0.0;
  local_158.x = 0.0;
  local_158.y = 0.0;
  Vector3::Vector3(&local_158);
  VVar4 = getProperty((Node *)uVar2,&local_148,&local_158);
  local_160 = VVar4.z;
  local_168 = VVar4._0_8_;
  (this->transparentColor).z = local_160;
  (this->transparentColor).x = (float)(int)local_168;
  (this->transparentColor).y = (float)(int)((ulong)local_168 >> 0x20);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator(&local_149);
  uVar2 = local_38._32_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,"SpecularColor",&local_189);
  local_198.z = 0.0;
  local_198.x = 0.0;
  local_198.y = 0.0;
  Vector3::Vector3(&local_198);
  VVar4 = getProperty((Node *)uVar2,&local_188,&local_198);
  local_1a0 = VVar4.z;
  local_1a8 = VVar4._0_8_;
  (this->specularColor).z = local_1a0;
  (this->specularColor).x = (float)(int)local_1a8;
  (this->specularColor).y = (float)(int)((ulong)local_1a8 >> 0x20);
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator(&local_189);
  uVar2 = local_38._32_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c8,"ShininessExponent",&local_1c9);
  local_1d8 = 2.0;
  dVar1 = getProperty<double>((Node *)uVar2,&local_1c8,&local_1d8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  uVar2 = local_38._32_8_;
  this->shininessExponent = dVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"Emissive",&local_1f9);
  local_208.z = 0.0;
  local_208.x = 0.0;
  local_208.y = 0.0;
  Vector3::Vector3(&local_208);
  VVar4 = getProperty((Node *)uVar2,&local_1f8,&local_208);
  local_210 = VVar4.z;
  local_218 = VVar4._0_8_;
  (this->emissive).z = local_210;
  (this->emissive).x = (float)(int)local_218;
  (this->emissive).y = (float)(int)((ulong)local_218 >> 0x20);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  uVar2 = local_38._32_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,"Ambient",&local_239);
  local_248.z = 0.0;
  local_248.x = 0.0;
  local_248.y = 0.0;
  Vector3::Vector3(&local_248);
  VVar4 = getProperty((Node *)uVar2,&local_238,&local_248);
  local_250 = VVar4.z;
  local_258 = VVar4._0_8_;
  (this->ambient).z = local_250;
  (this->ambient).x = (float)(int)local_258;
  (this->ambient).y = (float)(int)((ulong)local_258 >> 0x20);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator(&local_239);
  uVar2 = local_38._32_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,"Diffuse",&local_279);
  local_288.z = 0.0;
  local_288.x = 0.0;
  local_288.y = 0.0;
  Vector3::Vector3(&local_288);
  VVar4 = getProperty((Node *)uVar2,&local_278,&local_288);
  local_290 = VVar4.z;
  local_298 = VVar4._0_8_;
  (this->diffuse).z = local_290;
  (this->diffuse).x = (float)(int)local_298;
  (this->diffuse).y = (float)(int)((ulong)local_298 >> 0x20);
  std::__cxx11::string::~string((string *)&local_278);
  std::allocator<char>::~allocator(&local_279);
  uVar2 = local_38._32_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b8,"Specular",&local_2b9);
  local_2c8.z = 0.0;
  local_2c8.x = 0.0;
  local_2c8.y = 0.0;
  Vector3::Vector3(&local_2c8);
  VVar4 = getProperty((Node *)uVar2,&local_2b8,&local_2c8);
  local_2d0 = VVar4.z;
  local_2d8 = VVar4._0_8_;
  (this->specular).z = local_2d0;
  (this->specular).x = (float)(int)local_2d8;
  (this->specular).y = (float)(int)((ulong)local_2d8 >> 0x20);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::allocator<char>::~allocator(&local_2b9);
  uVar2 = local_38._32_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f8,"Shininess",&local_2f9);
  local_308 = 2.0;
  dVar1 = getProperty<double>((Node *)uVar2,&local_2f8,&local_308);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::allocator<char>::~allocator(&local_2f9);
  uVar2 = local_38._32_8_;
  this->shininess = dVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_328,"Opacity",&local_329);
  local_338 = 1.0;
  dVar1 = getProperty<double>((Node *)uVar2,&local_328,&local_338);
  std::__cxx11::string::~string((string *)&local_328);
  std::allocator<char>::~allocator(&local_329);
  uVar2 = local_38._32_8_;
  this->opacity = dVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_358,"Reflectivity",&local_359)
  ;
  local_368 = 0.0;
  dVar1 = getProperty<double>((Node *)uVar2,&local_358,&local_368);
  std::__cxx11::string::~string((string *)&local_358);
  std::allocator<char>::~allocator(&local_359);
  this->reflectivity = dVar1;
  return;
}

Assistant:

explicit Material(const Node &node) :
                Object(std::get<int64_t>(node.properties[0])),
                shadingModel(getProperty<std::string>(node, "ShadingModel", "phong")),
                emissiveFactor(getProperty(node, "EmissiveFactor", 0.0)),
                ambientColor(getProperty(node, "AmbientColor", {})),
                diffuseColor(getProperty(node, "DiffuseColor", {})),
                transparentColor(getProperty(node, "TransparentColor", {})),
                specularColor(getProperty(node, "SpecularColor", {})),
                shininessExponent(getProperty(node, "ShininessExponent", 2.0)),
                emissive(getProperty(node, "Emissive", {})),
                ambient(getProperty(node, "Ambient", {})),
                diffuse(getProperty(node, "Diffuse", {})),
                specular(getProperty(node, "Specular", {})),
                shininess(getProperty(node, "Shininess", 2.0)),
                opacity(getProperty(node, "Opacity", 1.0)),
                reflectivity(getProperty(node, "Reflectivity", 0.0)) {}